

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
::emplace_value<phmap::test_internal::MovableOnlyInstance>
          (btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
           *this,size_type i,allocator_type *alloc,MovableOnlyInstance *args)

{
  MovableOnlyInstance *pMVar1;
  allocator_type *paVar2;
  byte bVar3;
  byte bVar4;
  field_type fVar5;
  bool bVar6;
  slot_type *src;
  slot_type *dest;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *c;
  uint local_3c;
  allocator_type *paStack_38;
  int j_1;
  size_type j;
  MovableOnlyInstance *local_28;
  MovableOnlyInstance *args_local;
  allocator_type *alloc_local;
  size_type i_local;
  btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false>_>
  *this_local;
  
  local_28 = args;
  args_local = (MovableOnlyInstance *)alloc;
  alloc_local = (allocator_type *)i;
  i_local = (size_type)this;
  bVar3 = count(this);
  paVar2 = alloc_local;
  if (i <= bVar3) {
    bVar3 = count(this);
    if (paVar2 < (allocator_type *)(ulong)bVar3) {
      bVar3 = count(this);
      pMVar1 = args_local;
      bVar4 = count(this);
      j = (size_type)slot(this,(long)(int)(bVar4 - 1));
      btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
      ::value_init<phmap::test_internal::MovableOnlyInstance*>
                ((btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance,std::less<phmap::test_internal::MovableOnlyInstance>,phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,256,false>>
                  *)this,(ulong)bVar3,(allocator_type *)pMVar1,(MovableOnlyInstance **)&j);
      bVar3 = count(this);
      for (paStack_38 = (allocator_type *)(long)(int)(bVar3 - 1); pMVar1 = args_local,
          alloc_local < paStack_38;
          paStack_38 = (allocator_type *)((long)&paStack_38[-1].bytes_used_ + 7)) {
        src = slot(this,(size_type)((long)&paStack_38[-1].bytes_used_ + 7));
        dest = slot(this,(size_type)paStack_38);
        common_params<phmap::test_internal::MovableOnlyInstance,_std::less<phmap::test_internal::MovableOnlyInstance>,_phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>,_256,_false,_phmap::priv::set_slot_policy<phmap::test_internal::MovableOnlyInstance>_>
        ::move((CountingAllocator<phmap::test_internal::MovableOnlyInstance> *)pMVar1,src,dest);
      }
      value_destroy(this,(size_type)alloc_local,(allocator_type *)args_local);
    }
    value_init<phmap::test_internal::MovableOnlyInstance>
              (this,(size_type)alloc_local,(allocator_type *)args_local,local_28);
    fVar5 = count(this);
    set_count(this,fVar5 + '\x01');
    bVar6 = leaf(this);
    if (!bVar6) {
      bVar3 = count(this);
      if ((undefined1 *)((long)&alloc_local->bytes_used_ + 1U) < (undefined1 *)(ulong)bVar3) {
        bVar3 = count(this);
        for (local_3c = (uint)bVar3; (int)alloc_local + 1 < (int)local_3c; local_3c = local_3c - 1)
        {
          c = child(this,(long)(int)(local_3c - 1));
          set_child(this,(long)(int)local_3c,c);
        }
        clear_child(this,(size_type)((long)&alloc_local->bytes_used_ + 1));
      }
    }
    return;
  }
  __assert_fail("i <= count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x852,
                "void phmap::priv::btree_node<phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<phmap::test_internal::MovableOnlyInstance, std::less<phmap::test_internal::MovableOnlyInstance>, phmap::priv::CountingAllocator<phmap::test_internal::MovableOnlyInstance>, 256, false>, Args = <phmap::test_internal::MovableOnlyInstance>]"
               );
}

Assistant:

inline void btree_node<P>::emplace_value(const size_type i,
                                             allocator_type *alloc,
                                             Args &&... args) {
        assert(i <= count());
        // Shift old values to create space for new value and then construct it in
        // place.
        if (i < count()) {
            value_init(count(), alloc, slot(count() - 1));
            for (size_type j = count() - 1; j > i; --j)
                params_type::move(alloc, slot(j - 1), slot(j));
            value_destroy(i, alloc);
        }
        value_init(i, alloc, std::forward<Args>(args)...);
        set_count((field_type)(count() + 1));

        if (!leaf() && count() > i + 1) {
            for (int j = count(); j > (int)(i + 1); --j) {
                set_child(j, child(j - 1));
            }
            clear_child(i + 1);
        }
    }